

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerMd5WithRsaEncryptionNullParams_Test::TestBody
          (SignatureAlgorithmTest_ParseDerMd5WithRsaEncryptionNullParams_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_a0;
  AssertHelper local_80 [3];
  Message local_68;
  Span<const_unsigned_char> local_60;
  Span<const_unsigned_char> local_50;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_3c;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  uint8_t kData [15];
  SignatureAlgorithmTest_ParseDerMd5WithRsaEncryptionNullParams_Test *this_local;
  
  stack0xffffffffffffffe1 = 0x8648862a09060d30;
  Span<unsigned_char_const>::Span<15ul>
            ((Span<unsigned_char_const> *)&local_60,
             (uchar (*) [15])
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 1));
  bssl::der::Input::Input((Input *)&local_50,local_60);
  local_3c = (_Optional_payload_base<bssl::SignatureAlgorithm>)
             ParseSignatureAlgorithm((Input)local_50);
  bVar1 = ::std::optional::operator_cast_to_bool((optional *)&local_3c);
  local_31 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_30,
               (AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))","true","false",in_R9)
    ;
    message = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x55f,message);
    testing::internal::AssertHelper::operator=(local_80,&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerMd5WithRsaEncryptionNullParams) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x04,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}